

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptint.c
# Opt level: O2

int POPT_fprintf(FILE *stream,char *format,...)

{
  char in_AL;
  uint uVar1;
  int iVar2;
  char *__s;
  ulong uVar3;
  char *pcVar4;
  iconv_t __cd;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  char *pcVar9;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong __maxlen;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *pout;
  char *pin;
  char *local_128;
  FILE *local_120;
  size_t local_118;
  size_t ib;
  va_list ap;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  __maxlen = 1;
  __s = (char *)0x0;
  local_120 = (FILE *)stream;
  local_d8 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  while( true ) {
    while( true ) {
      __s = (char *)realloc(__s,__maxlen + 1);
      if (__s == (char *)0x0) {
        return 0;
      }
      ap[0].overflow_arg_area = &stack0x00000008;
      ap[0].gp_offset = 0x10;
      ap[0].fp_offset = 0x30;
      ap[0].reg_save_area = local_e8;
      uVar1 = vsnprintf(__s,__maxlen,format,ap);
      if (-1 < (int)uVar1) break;
      uVar3 = 100;
      if (100 < __maxlen) {
        uVar3 = __maxlen;
      }
      __maxlen = __maxlen + uVar3;
    }
    if (uVar1 < __maxlen) break;
    __maxlen = (ulong)(uVar1 + 1);
  }
  pcVar4 = nl_langinfo(0xe);
  if (((pcVar4 == (char *)0x0) || (iVar2 = strcmp(pcVar4,"UTF-8"), iVar2 == 0)) ||
     (__cd = iconv_open(pcVar4,"UTF-8"), __cd == (iconv_t)0xffffffffffffffff)) {
    sVar5 = strlen(__s);
    pcVar9 = (char *)malloc(sVar5 + 1);
    if (pcVar9 == (char *)0x0) {
LAB_00107535:
      fwrite("virtual memory exhausted.\n",0x1a,1,_stderr);
      exit(1);
    }
    strcpy(pcVar9,__s);
  }
  else {
    sVar5 = strlen(__s);
    pcVar4 = (char *)malloc(sVar5 + 1);
    pout = pcVar4;
    pin = __s;
    local_118 = sVar5;
    ib = sVar5;
    if (pcVar4 == (char *)0x0) {
LAB_0010750f:
      iconv_close(__cd);
      iVar2 = fprintf(local_120,"%s",__s);
      goto LAB_001074ad;
    }
    local_128 = (char *)0x0;
    iconv(__cd,(char **)0x0,(size_t *)0x0,(char **)0x0,(size_t *)0x0);
    pcVar9 = pcVar4;
    while( true ) {
      while( true ) {
        *pcVar9 = '\0';
        sVar6 = iconv(__cd,&pin,&ib,&pout,&local_118);
        if (sVar6 == 0xffffffffffffffff) break;
        if (local_128 != (char *)0x0) goto LAB_001074ca;
        local_128 = pin;
        pin = (char *)0x0;
        ib = 0;
        pcVar9 = pout;
      }
      piVar7 = __errno_location();
      pcVar9 = pout;
      if (*piVar7 != 7) break;
      pcVar8 = (char *)realloc(pcVar4,sVar5 * 2 + 1);
      if (pcVar8 == (char *)0x0) {
        free(pcVar4);
        goto LAB_0010750f;
      }
      sVar5 = sVar5 * 2;
      pout = pcVar8 + ((long)pcVar9 - (long)pcVar4);
      local_118 = sVar5 - ((long)pcVar9 - (long)pcVar4);
      pcVar4 = pcVar8;
      pcVar9 = pout;
    }
LAB_001074ca:
    iconv_close(__cd);
    *pout = '\0';
    sVar5 = strlen(pcVar4);
    pcVar9 = (char *)malloc(sVar5 + 1);
    if (pcVar9 == (char *)0x0) goto LAB_00107535;
    strcpy(pcVar9,pcVar4);
    free(pcVar4);
  }
  iVar2 = fprintf(local_120,"%s",pcVar9);
  free(pcVar9);
LAB_001074ad:
  free(__s);
  return iVar2;
}

Assistant:

int
POPT_fprintf (FILE * stream, const char * format, ...)
{
    char * b = NULL, * ob = NULL;
    int rc;
    va_list ap;

#if defined(HAVE_VASPRINTF)
    va_start(ap, format);
    if ((rc = vasprintf(&b, format, ap)) < 0)
	b = NULL;
    va_end(ap);
#else
    size_t nb = (size_t)1;

    /* HACK: add +1 to the realloc no. of bytes "just in case". */
    /* XXX Likely unneeded, the issues wrto vsnprintf(3) return b0rkage have
     * to do with whether the final '\0' is counted (or not). The code
     * below already adds +1 for the (possibly already counted) trailing NUL.
     */
    while ((b = realloc(b, nb+1)) != NULL) {
	va_start(ap, format);
	rc = vsnprintf(b, nb, format, ap);
	va_end(ap);
	if (rc > -1) {	/* glibc 2.1 */
	    if ((size_t)rc < nb)
		break;
	    nb = (size_t)(rc + 1);	/* precise buffer length known */
	} else 		/* glibc 2.0 */
	    nb += (nb < (size_t)100 ? (size_t)100 : nb);
	ob = b;
    }
#endif

    rc = 0;
    if (b != NULL) {
#ifdef HAVE_ICONV
	ob = strdup_locale_from_utf8(b);
	if (ob != NULL) {
	    rc = fprintf(stream, "%s", ob);
	    free(ob);
	} else
#endif
	    rc = fprintf(stream, "%s", b);
	free (b);
    }

    return rc;
}